

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.h
# Opt level: O2

void __thiscall
miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::
TimerQueueCallback::~TimerQueueCallback(TimerQueueCallback *this)

{
  mutex *__mutex;
  TimerInfoPtr info;
  __shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
  local_20;
  
  (this->super_CallbackInterface)._vptr_CallbackInterface =
       (_func_int **)&PTR__TimerQueueCallback_002f1a00;
  std::
  __shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_20,&this->info_);
  if (local_20._M_ptr != (element_type *)0x0) {
    __mutex = &(local_20._M_ptr)->waiting_mutex;
    std::mutex::lock(__mutex);
    (local_20._M_ptr)->waiting_callbacks = (local_20._M_ptr)->waiting_callbacks - 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->info_).
              super___weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

~TimerQueueCallback()
    {
      TimerInfoPtr info = info_.lock();
      if (info)
      {
        std::scoped_lock<std::mutex> lock(info->waiting_mutex);
        --info->waiting_callbacks;
      }
    }